

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# daemons.cpp
# Opt level: O2

int rollwand(int arg)

{
  bool bVar1;
  int type;
  int iVar2;
  
  iVar2 = between + 1;
  bVar1 = 2 < between;
  between = iVar2;
  if (bVar1) {
    iVar2 = roll(1,6);
    if (iVar2 == 4) {
      wanderer();
      kill_daemon(rollwand);
      iVar2 = spread(0x46);
      type = spread(1);
      fuse(swander,0,iVar2,type);
    }
    between = 0;
  }
  return 0;
}

Assistant:

int rollwand(int arg)
{

    if (++between >= 4)
    {
        if (roll(1, 6) == 4)
        {
            wanderer();
            kill_daemon(rollwand);
            fuse(swander, 0, WANDERTIME, BEFORE);
        }
        between = 0;
    }
    return 0;
}